

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O3

void __thiscall
SolverTest_ValueArrayRef_Test::~SolverTest_ValueArrayRef_Test(SolverTest_ValueArrayRef_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SolverTest, ValueArrayRef) {
  const mp::OptionValueInfo values[] = {
      {"val1", "description of val1", 0},
      {"val2", "description of val2", 0}
  };
  mp::ValueArrayRef r(values);
  EXPECT_EQ(2, r.size());
  mp::ValueArrayRef::iterator i = r.begin();
  EXPECT_NE(i, r.end());
  EXPECT_STREQ("val1", i->value);
  ++i;
  EXPECT_STREQ("val2", i->value);
  ++i;
  EXPECT_EQ(i, r.end());
}